

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGlobalGenerator *pcVar3;
  cmLocalGenerator *this_00;
  pointer pcVar4;
  pointer ppcVar5;
  cmGeneratorTarget *this_01;
  cmGeneratedFileStream *fout_00;
  string *makeArgs;
  int iVar6;
  TargetType TVar7;
  string *psVar8;
  string *path;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  pointer ppcVar12;
  pointer ppcVar13;
  string currentDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string local_b0;
  cmGeneratedFileStream *local_90;
  cmExtraKateGenerator *local_88;
  undefined4 local_7c;
  string *local_78;
  string *local_70;
  string local_68;
  pointer local_48;
  cmLocalGenerator *local_40;
  pointer local_38;
  
  pcVar2 = lg->Makefile;
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  local_88 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_MAKE_PROGRAM","");
  psVar8 = cmMakefile::GetRequiredDefinition(pcVar2,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"CMAKE_KATE_MAKE_ARGUMENTS","");
  local_70 = cmMakefile::GetSafeDefinition(pcVar2,&local_b0);
  local_90 = fout;
  local_78 = psVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  fout_00 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_90,"\t\"build\": {\n\t\t\"directory\": \"",0x1c);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"build\": \"",0xc);
  psVar8 = local_78;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(local_78->_M_dataplus)._M_p,local_78->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," -C \\\"",6);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\\" ",3);
  makeArgs = local_70;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_70->_M_dataplus)._M_p,local_70->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"all\",\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"clean\": \"",0xc);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," -C \\\"",6);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\\" ",3);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"clean\",\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"quick\": \"",0xc);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," -C \\\"",6);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\\" ",3);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"install\",\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"targets\":[\n",0xe);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"all","");
  AppendTarget(local_88,fout_00,&local_b0,psVar8,makeArgs,path,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"clean","");
  AppendTarget(local_88,local_90,&local_b0,local_78,makeArgs,path,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (local_88->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar12 = (pcVar3->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = (pcVar3->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar12 != local_48) {
    do {
      this_00 = *ppcVar12;
      psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      pcVar4 = (psVar8->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar4,pcVar4 + psVar8->_M_string_length);
      psVar8 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
      local_38 = ppcVar12;
      if (local_b0._M_string_length == psVar8->_M_string_length) {
        if (local_b0._M_string_length == 0) {
          local_7c = (undefined4)CONCAT71((int7)((ulong)psVar8 >> 8),1);
        }
        else {
          iVar6 = bcmp(local_b0._M_dataplus._M_p,(psVar8->_M_dataplus)._M_p,
                       local_b0._M_string_length);
          local_7c = CONCAT31((int3)((uint)iVar6 >> 8),iVar6 == 0);
        }
      }
      else {
        local_7c = 0;
      }
      ppcVar5 = (this_00->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_40 = this_00;
      for (ppcVar13 = (this_00->GeneratorTargets).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar5;
          ppcVar13 = ppcVar13 + 1) {
        this_01 = *ppcVar13;
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        TVar7 = cmGeneratorTarget::GetType(this_01);
        if (TVar7 < UTILITY) {
          AppendTarget(local_88,local_90,psVar8,local_78,local_70,&local_b0,path);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          pcVar4 = (psVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar4,pcVar4 + psVar8->_M_string_length);
          std::__cxx11::string::append((char *)&local_68);
          AppendTarget(local_88,local_90,&local_68,local_78,local_70,&local_b0,path);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        else if (TVar7 == UTILITY) {
          lVar10 = std::__cxx11::string::find((char *)psVar8,0x4fbe6e,0);
          if ((((lVar10 != 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar8), iVar6 == 0)
               ) && ((lVar10 = std::__cxx11::string::find((char *)psVar8,0x4fbe76,0), lVar10 != 0 ||
                     (iVar6 = std::__cxx11::string::compare((char *)psVar8), iVar6 == 0)))) &&
             ((lVar10 = std::__cxx11::string::find((char *)psVar8,0x4fbe81,0), lVar10 != 0 ||
              (iVar6 = std::__cxx11::string::compare((char *)psVar8), iVar6 == 0)))) {
            AppendTarget(local_88,local_90,psVar8,local_78,local_70,&local_b0,path);
          }
        }
        else if ((TVar7 == GLOBAL_TARGET) && ((char)local_7c != '\0')) {
          iVar6 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar6 == 0) {
            pcVar2 = local_40->Makefile;
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"CMAKE_EDIT_COMMAND","");
            pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((pcVar11 == (char *)0x0) ||
               (pcVar11 = strstr(pcVar11,"ccmake"), pcVar11 != (char *)0x0)) goto LAB_0026152b;
          }
          AppendTarget(local_88,local_90,psVar8,local_78,local_70,&local_b0,path);
        }
LAB_0026152b:
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      ppcVar12 = local_38 + 1;
    } while (ppcVar12 != local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_90,"\t] }\n",5);
  return;
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator* lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg->GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg->GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* localGen :
       this->GlobalGenerator->GetLocalGenerators()) {
    const std::vector<cmGeneratorTarget*>& targets =
      localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (cmGeneratorTarget* target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              const char* editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (editCommand == nullptr) {
                insertTarget = false;
              } else if (strstr(editCommand, "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}